

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_text_sized(LodePNGInfo *info,char *key,char *str,size_t size)

{
  char **ppcVar1;
  char **ppcVar2;
  char *pcVar3;
  char **new_strings;
  char **new_keys;
  size_t size_local;
  char *str_local;
  char *key_local;
  LodePNGInfo *info_local;
  
  ppcVar1 = (char **)lodepng_realloc(info->text_keys,(info->text_num + 1) * 8);
  ppcVar2 = (char **)lodepng_realloc(info->text_strings,(info->text_num + 1) * 8);
  if (ppcVar1 != (char **)0x0) {
    info->text_keys = ppcVar1;
  }
  if (ppcVar2 != (char **)0x0) {
    info->text_strings = ppcVar2;
  }
  if ((ppcVar1 == (char **)0x0) || (ppcVar2 == (char **)0x0)) {
    info_local._4_4_ = 0x53;
  }
  else {
    info->text_num = info->text_num + 1;
    pcVar3 = alloc_string(key);
    info->text_keys[info->text_num - 1] = pcVar3;
    pcVar3 = alloc_string_sized(str,size);
    info->text_strings[info->text_num - 1] = pcVar3;
    if ((info->text_keys[info->text_num - 1] == (char *)0x0) ||
       (info->text_strings[info->text_num - 1] == (char *)0x0)) {
      info_local._4_4_ = 0x53;
    }
    else {
      info_local._4_4_ = 0;
    }
  }
  return info_local._4_4_;
}

Assistant:

static unsigned lodepng_add_text_sized(LodePNGInfo* info, const char* key, const char* str, size_t size) {
  char** new_keys = (char**)(lodepng_realloc(info->text_keys, sizeof(char*) * (info->text_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->text_strings, sizeof(char*) * (info->text_num + 1)));

  if(new_keys) info->text_keys = new_keys;
  if(new_strings) info->text_strings = new_strings;

  if(!new_keys || !new_strings) return 83; /*alloc fail*/

  ++info->text_num;
  info->text_keys[info->text_num - 1] = alloc_string(key);
  info->text_strings[info->text_num - 1] = alloc_string_sized(str, size);
  if(!info->text_keys[info->text_num - 1] || !info->text_strings[info->text_num - 1]) return 83; /*alloc fail*/

  return 0;
}